

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

CborError jsonObjectToCbor(CborEncoder *parent,QJsonObject *o)

{
  CborError CVar1;
  size_t length;
  ulong uVar2;
  char *string;
  QCborContainerPrivate *pQVar3;
  long in_FS_OFFSET;
  const_iterator cVar4;
  QJsonValueConstRef local_b8;
  QArrayDataPointer<char> local_a8;
  anon_union_8_3_8ebc2b8a_for_data local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QJsonValueConstRef local_60;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (o->o).d.ptr;
  local_60._8_8_ = 1;
  local_60.d = pQVar3;
  cVar4 = QJsonObject::constEnd(o);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  length = QJsonObject::size(o);
  cbor_encoder_create_map(parent,(CborEncoder *)&local_88,length);
  uVar2 = 1;
  while ((pQVar3 != cVar4.item.d || (1 < (uVar2 ^ cVar4.item._8_8_)))) {
    local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QJsonValueConstRef::objectKey((QString *)&local_50,&local_60);
    QString::toUtf8_helper((QByteArray *)&local_a8,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    string = local_a8.ptr;
    if (local_a8.ptr == (char *)0x0) {
      string = &QByteArray::_empty;
    }
    cbor_encode_text_string((CborEncoder *)&local_88,string,local_a8.size);
    local_b8.d = local_60.d;
    local_b8._8_8_ = local_60._8_8_;
    QJsonValueConstRef::operator_cast_to_QJsonValue((QJsonValue *)&local_50,&local_b8);
    jsonValueToCbor((CborEncoder *)&local_88,(QJsonValue *)&local_50);
    QJsonValue::~QJsonValue((QJsonValue *)&local_50);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
    uVar2 = local_60._8_8_ + 2;
    pQVar3 = local_60.d;
    local_60._8_8_ = uVar2;
  }
  CVar1 = cbor_encoder_close_container(parent,(CborEncoder *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return CVar1;
  }
  __stack_chk_fail();
}

Assistant:

static CborError jsonObjectToCbor(CborEncoder *parent, const QJsonObject &o)
{
    auto it = o.constBegin();
    auto end = o.constEnd();
    CborEncoder map;
    cbor_encoder_create_map(parent, &map, o.size());

    for ( ; it != end; ++it) {
        QByteArray key = it.key().toUtf8();
        cbor_encode_text_string(&map, key.constData(), key.size());
        jsonValueToCbor(&map, it.value());
    }
    return cbor_encoder_close_container(parent, &map);
}